

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O2

CharMapper<unsigned_char> * gmlc::utilities::digitMapper(void)

{
  long lVar1;
  CharMapper<unsigned_char> *in_RDI;
  
  memset(in_RDI,0xff,0x100);
  for (lVar1 = 0; (uchar)lVar1 != '\n'; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1 + 0x30] = (uchar)lVar1;
  }
  return in_RDI;
}

Assistant:

CharMapper<unsigned char> digitMapper()
{
    CharMapper<unsigned char> dMap(0xFF);
    unsigned char val = 0;
    for (unsigned char indexChar = '0'; indexChar <= '9'; ++indexChar) {
        dMap.addKey(indexChar, val);
        ++val;
    }
    return dMap;
}